

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkSuppSizeTest(Au_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  Au_Obj_t *p_00;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Au_Obj_t *pObj;
  Au_Ntk_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_IntSize(&p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = Au_NtkObjI(p,local_1c);
    iVar1 = Au_ObjIsNode(p_00);
    if (iVar1 != 0) {
      iVar1 = Au_ObjSuppSize(p_00);
      local_20 = (iVar1 < 0x11) + local_20;
    }
  }
  uVar2 = Au_NtkNodeNum(p);
  printf("Nodes with small support %d (out of %d)\n",(ulong)local_20,(ulong)uVar2);
  return local_20;
}

Assistant:

int Au_NtkSuppSizeTest( Au_Ntk_t * p )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    Au_NtkForEachObj( p, pObj, i )
        if ( Au_ObjIsNode(pObj) )
            Counter += (Au_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Au_NtkNodeNum(p) );
    return Counter;
}